

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::openpipe(summarycalc *this,int summary_id,string *pipe)

{
  FILE *__stream;
  bool bVar1;
  char *__filename;
  FILE *pFVar2;
  ulong uVar3;
  long lVar4;
  mapped_type *this_00;
  undefined8 uVar5;
  bool local_a1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  int *local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  string local_48 [8];
  string indexFileName;
  FILE *f;
  string *pipe_local;
  summarycalc *psStack_10;
  int summary_id_local;
  summarycalc *this_local;
  
  pipe_local._4_4_ = summary_id;
  psStack_10 = this;
  bVar1 = std::operator==(pipe,"-");
  if (bVar1) {
    this->fout[(int)pipe_local._4_4_] = _stdout;
  }
  else {
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(__filename,"wb");
    __stream = _stderr;
    if (pFVar2 == (FILE *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      fprintf(__stream,"FATAL: %s: Cannot open %s for output\n","openpipe",uVar5);
      exit(-1);
    }
    this->fout[(int)pipe_local._4_4_] = (FILE *)pFVar2;
    std::__cxx11::string::string(local_48,(string *)pipe);
    uVar3 = std::__cxx11::string::length();
    it._M_current._3_1_ = 0;
    local_a1 = false;
    if (4 < uVar3) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_68,(ulong)pipe);
      it._M_current._3_1_ = 1;
      local_a1 = std::operator==(local_68,".bin");
    }
    if ((it._M_current._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)local_68);
    }
    if (local_a1 != false) {
      lVar4 = std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)local_48,lVar4 - 4);
    }
    std::__cxx11::string::operator+=(local_48,".idx");
    this_00 = std::
              map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->indexFiles,(key_type *)((long)&pipe_local + 4));
    std::__cxx11::string::operator=((string *)this_00,local_48);
    std::__cxx11::string::~string(local_48);
  }
  local_88._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->foutIndex_);
  local_90 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->foutIndex_);
  local_80 = std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                       (local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_90,(int *)((long)&pipe_local + 4));
  local_98._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->foutIndex_);
  bVar1 = __gnu_cxx::operator!=(&local_80,&local_98);
  if (bVar1) {
    fprintf(_stderr,"FATAL: %s: Summary set ID %d requested at least twice\n","openpipe",
            (ulong)pipe_local._4_4_);
    exit(1);
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->foutIndex_,(value_type *)((long)&pipe_local + 4));
  return;
}

Assistant:

void summarycalc::openpipe(int summary_id, const std::string &pipe)
{
	if (pipe == "-") fout[summary_id] = stdout;
	else {
		FILE *f = fopen(pipe.c_str(), "wb");
		if (f != nullptr) {
			fout[summary_id] = f;
			std::string indexFileName = pipe;
			if (pipe.length() > 4 && pipe.substr(pipe.length() - 4, 4) == ".bin") {
				indexFileName.erase(indexFileName.length() - 4);
			}
			indexFileName += ".idx";
			indexFiles[summary_id] = indexFileName;
		} else {
			fprintf(stderr, "FATAL: %s: Cannot open %s for output\n", __func__, pipe.c_str());
			::exit(-1);
		}
	}
	auto it = std::find(foutIndex_.begin(), foutIndex_.end(), summary_id);
	if (it != foutIndex_.end()) {
		fprintf(stderr, "FATAL: %s: Summary set ID %d requested at least twice\n",
			__func__, summary_id);
		exit(EXIT_FAILURE);
	}
	foutIndex_.push_back(summary_id);
}